

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::SetRepeatedEnum
          (ExtensionSet *this,int number,int index,int value)

{
  Extension *pEVar1;
  string *psVar2;
  pointer piVar3;
  anon_enum_32 local_2c;
  anon_enum_32 local_28 [4];
  
  pEVar1 = FindOrNull(this,number);
  if (pEVar1 == (Extension *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,0x21f,0x14,"extension != nullptr");
    absl::lts_20240722::log_internal::LogMessage::operator<<
              ((LogMessage *)local_28,(char (*) [38])"Index out-of-bounds (field is empty).");
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28)
    ;
  }
  local_28[0] = pEVar1->is_repeated ^ OPTIONAL_FIELD;
  local_2c = REPEATED_FIELD;
  psVar2 = absl::lts_20240722::log_internal::
           Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                     (local_28,&local_2c,
                      "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == REPEATED_FIELD"
                     );
  if (psVar2 == (string *)0x0) {
    local_28[0] = anon_unknown_58::cpp_type(pEVar1->type);
    local_2c = 8;
    psVar2 = absl::lts_20240722::log_internal::
             Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                       (local_28,&local_2c,
                        "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM");
    if (psVar2 == (string *)0x0) {
      piVar3 = RepeatedField<int>::Mutable((RepeatedField<int> *)pEVar1->field_0,index);
      *piVar3 = value;
      return;
    }
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
             ,0x220,psVar2->_M_string_length,(psVar2->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28);
}

Assistant:

void ExtensionSet::SetRepeatedEnum(int number, int index, int value) {
  Extension* extension = FindOrNull(number);
  ABSL_CHECK(extension != nullptr) << "Index out-of-bounds (field is empty).";
  ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, ENUM);
  extension->ptr.repeated_enum_value->Set(index, value);
}